

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O2

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  cmAlphaNum local_68;
  cmAlphaNum local_38;
  
  if ((this->Suffix)._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Name);
  }
  else {
    local_38.View_._M_str = (this->Name)._M_dataplus._M_p;
    local_38.View_._M_len = (this->Name)._M_string_length;
    local_68.View_._M_str = local_68.Digits_;
    local_68.View_._M_len = 1;
    local_68.Digits_[0] = ',';
    cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_38,&local_68,&this->Suffix);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetLinkName() const
    {
      return this->Suffix.empty() ? this->Name
                                  : cmStrCat(this->Name, ',', this->Suffix);
    }